

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CS248::Application::cursor_event(Application *this,float x,float y)

{
  long in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  Application *unaff_retaddr;
  float y_00;
  float x_00;
  
  y_00 = (float)in_RDI;
  x_00 = (float)((ulong)in_RDI >> 0x20);
  if ((((*(byte *)(in_RDI + 0x204) & 1) == 0) || ((*(byte *)(in_RDI + 0x206) & 1) != 0)) ||
     ((*(byte *)(in_RDI + 0x205) & 1) != 0)) {
    if ((((*(byte *)(in_RDI + 0x204) & 1) == 0) && ((*(byte *)(in_RDI + 0x206) & 1) == 0)) &&
       ((*(byte *)(in_RDI + 0x205) & 1) != 0)) {
      mouse2_dragged((Application *)CONCAT44(in_XMM0_Da,in_XMM1_Da),x_00,y_00);
    }
    else if ((((*(byte *)(in_RDI + 0x204) & 1) == 0) && ((*(byte *)(in_RDI + 0x206) & 1) == 0)) &&
            ((*(byte *)(in_RDI + 0x205) & 1) == 0)) {
      mouse_moved(unaff_retaddr,x_00,y_00);
    }
  }
  else {
    mouse1_dragged((Application *)CONCAT44(in_XMM0_Da,in_XMM1_Da),x_00,y_00);
  }
  *(undefined4 *)(in_RDI + 0x1fc) = in_XMM0_Da;
  *(undefined4 *)(in_RDI + 0x200) = in_XMM1_Da;
  return;
}

Assistant:

void Application::cursor_event(float x, float y) {
    if (leftDown && !middleDown && !rightDown) {
        mouse1_dragged(x, y);
    } else if (!leftDown && !middleDown && rightDown) {
        mouse2_dragged(x, y);
    } else if (!leftDown && !middleDown && !rightDown) {
        mouse_moved(x, y);
    }

    mouseX = x;
    mouseY = y;
}